

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O2

void __thiscall qpdf::Stream::warn(Stream *this,string *message)

{
  QPDF *this_00;
  allocator<char> local_41;
  string local_40;
  
  this_00 = ((this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->qpdf;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  QPDF::warn(this_00,qpdf_e_damaged_pdf,&local_40,
             ((this->super_BaseHandle).obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->parsed_offset,
             message);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void
Stream::warn(std::string const& message)
{
    obj->getQPDF()->warn(qpdf_e_damaged_pdf, "", obj->getParsedOffset(), message);
}